

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-math.h
# Opt level: O0

long wabt::interp::IntTruncSat<long,float>(float val)

{
  bool bVar1;
  uint uVar2;
  long lVar3;
  long lStack_10;
  float val_local;
  
  uVar2 = std::isnan((double)(ulong)(uint)val);
  if ((uVar2 & 1) == 0) {
    bVar1 = CanConvert<long,float>((f32)val);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      lStack_10 = (long)val;
    }
    else {
      bVar1 = std::signbit(val);
      lVar3 = std::numeric_limits<long>::min();
      lStack_10 = std::numeric_limits<long>::max();
      if (bVar1) {
        lStack_10 = lVar3;
      }
    }
  }
  else {
    lStack_10 = 0;
  }
  return lStack_10;
}

Assistant:

R WABT_VECTORCALL IntTruncSat(T val) {
  if (WABT_UNLIKELY(std::isnan(val))) {
    return 0;
  } else if (WABT_UNLIKELY(!CanConvert<R>(val))) {
    return std::signbit(val) ? std::numeric_limits<R>::min()
                             : std::numeric_limits<R>::max();
  } else {
    return static_cast<R>(val);
  }
}